

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

Vector<Fad<double>_> * __thiscall
Vector<Fad<double>_>::operator=(Vector<Fad<double>_> *this,Vector<Fad<double>_> *a)

{
  EVP_PKEY_CTX *in_RDX;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  Vector<Fad<double>_> *in_RSI;
  Vector<Fad<double>_> *in_RDI;
  Vector<Fad<double>_> *unaff_retaddr;
  int in_stack_0000006c;
  Vector<Fad<double>_> *in_stack_00000070;
  
  if (in_RDI != in_RSI) {
    if (in_RDI->num_elts == 0) {
      if (in_RSI->num_elts == 0) {
        return in_RDI;
      }
      reserve(in_stack_00000070,in_stack_0000006c);
      in_RDX = extraout_RDX;
    }
    if (in_RDI->num_elts != in_RSI->num_elts) {
      destroy(unaff_retaddr);
      reserve(in_stack_00000070,in_stack_0000006c);
      in_RDX = extraout_RDX_00;
    }
    copy(in_RDI,(EVP_PKEY_CTX *)in_RSI,in_RDX);
  }
  return in_RDI;
}

Assistant:

Vector< T >& Vector< T >::operator = (const Vector< T >& a)
{
  if ( this != &a) {
    // Cas ou le pointeur est non alloue
    if ( num_elts == 0 ) {
      if ( a.num_elts == 0 ) return (*this);
      else reserve(a.num_elts);
    }
    // Cas ou le pointeur est deja alloue
    if ( num_elts != a.num_elts ) {
      //cerr << "size = " << num_elts << ", a.size = " << a.num_elts << endl;
      //cerr << "ptr_to_data = " << (void*)ptr_to_data << ", a.ptr_to_data = " << (void*)a.ptr_to_data << endl;
      //error("Vector::operator=, tailles incompatibles");
      destroy();//on desalloue
      reserve(a.num_elts);
    }
    
    copy(a);
  }

  return *this;
}